

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

optional<tinyusdz::value::Value> * __thiscall
tinyusdz::XformOp::get_scalar
          (optional<tinyusdz::value::Value> *__return_storage_ptr__,XformOp *this)

{
  bool bVar1;
  Value *value;
  XformOp *this_local;
  
  bVar1 = has_default(this);
  if (bVar1) {
    value = primvar::PrimVar::value_raw(&this->_var);
    nonstd::optional_lite::optional<tinyusdz::value::Value>::
    optional<const_tinyusdz::value::Value_&,_0>(__return_storage_ptr__,value);
  }
  else {
    nonstd::optional_lite::optional<tinyusdz::value::Value>::optional(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<value::Value> get_scalar() const {
    if (has_default()) {
      return _var.value_raw();
    }
    return nonstd::nullopt;
  }